

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_20d90e::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader
          (JobEvalCacheMocT *this,SourceFileHandleT *headerHandle,string_view includerDir,
          string_view includeBase)

{
  void *pvVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  long lVar4;
  long lVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  anon_class_16_2_3be181d0 findHeader;
  size_t local_d0;
  char *local_c8;
  cmAlphaNum local_c0;
  string local_90;
  anon_class_16_2_3be181d0 local_70;
  cmAlphaNum local_60;
  
  local_d0 = includeBase._M_len;
  local_c8 = includeBase._M_str;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->super_JobEvalCacheT).SearchLocations);
  local_c0.View_._M_len = includerDir._M_len;
  local_c0.View_._M_str = includerDir._M_str;
  local_70.this = this;
  local_70.headerHandle = headerHandle;
  local_60.View_._M_len = includeBase._M_len;
  local_60.View_._M_str = includeBase._M_str;
  cmStrCat<>(&local_90,&local_c0,&local_60);
  bVar3 = FindIncludedHeader::anon_class_16_2_3be181d0::operator()(&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (bVar3) {
    return true;
  }
  pvVar1 = ((this->super_JobEvalCacheT).super_JobT.super_JobT.Pool_)->UserData_;
  __it._M_current =
       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)((long)pvVar1 + 0x380)
  ;
  pbVar2 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            ((long)pvVar1 + 0x388);
  local_c0.View_._M_str = (char *)&local_d0;
  lVar5 = (long)pbVar2 - (long)__it._M_current;
  local_c0.View_._M_len = (size_t)&local_70;
  for (lVar4 = lVar5 >> 7; 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_c0,__it);
    _Var6._M_current = __it._M_current;
    if (bVar3) goto LAB_001a51d0;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_c0,__it._M_current + 1);
    _Var6._M_current = __it._M_current + 1;
    if (bVar3) goto LAB_001a51d0;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_c0,__it._M_current + 2);
    _Var6._M_current = __it._M_current + 2;
    if (bVar3) goto LAB_001a51d0;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_c0,__it._M_current + 3);
    _Var6._M_current = __it._M_current + 3;
    if (bVar3) goto LAB_001a51d0;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x80;
  }
  lVar5 = lVar5 >> 5;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var6._M_current = pbVar2;
      if ((lVar5 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::$_0>
                  ::operator()((_Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                                *)&local_c0,__it), _Var6._M_current = __it._M_current, bVar3))
      goto LAB_001a51d0;
      __it._M_current = __it._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&local_c0,__it);
    _Var6._M_current = __it._M_current;
    if (bVar3) goto LAB_001a51d0;
    __it._M_current = __it._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::$_0>
          ::operator()((_Iter_pred<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                        *)&local_c0,__it);
  _Var6._M_current = __it._M_current;
  if (!bVar3) {
    _Var6._M_current = pbVar2;
  }
LAB_001a51d0:
  return _Var6._M_current != pbVar2;
}

Assistant:

bool cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(
  SourceFileHandleT& headerHandle, cm::string_view includerDir,
  cm::string_view includeBase)
{
  // Clear search locations
  this->SearchLocations.clear();

  auto findHeader = [this,
                     &headerHandle](std::string const& basePath) -> bool {
    bool found = false;
    for (std::string const& ext : this->BaseConst().HeaderExtensions) {
      std::string const testPath =
        this->Gen()->CollapseFullPathTS(cmStrCat(basePath, '.', ext));
      cmFileTime fileTime;
      if (!fileTime.Load(testPath)) {
        // File not found
        continue;
      }

      // Return a known file if it exists already
      {
        auto it = this->BaseEval().Headers.find(testPath);
        if (it != this->BaseEval().Headers.end()) {
          headerHandle = it->second;
          found = true;
          break;
        }
      }

      // Created and return discovered file entry
      {
        SourceFileHandleT& handle =
          this->MocEval().HeadersDiscovered[testPath];
        if (!handle) {
          handle = std::make_shared<SourceFileT>(testPath);
          handle->FileTime = fileTime;
          handle->IsHeader = true;
          handle->Moc = true;
        }
        headerHandle = handle;
        found = true;
        break;
      }
    }
    if (!found) {
      this->SearchLocations.emplace_back(cmQtAutoGen::ParentDir(basePath));
    }
    return found;
  };

  // Search in vicinity of the source
  if (findHeader(cmStrCat(includerDir, includeBase))) {
    return true;
  }
  // Search in include directories
  auto const& includePaths = this->MocConst().IncludePaths;
  return std::any_of(
    includePaths.begin(), includePaths.end(),
    [&findHeader, &includeBase](std::string const& path) -> bool {
      return findHeader(cmStrCat(path, '/', includeBase));
    });
}